

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::CloseGap(ON_PolyCurve *this,int gap_index,int ends_to_modify)

{
  double dVar1;
  ON_Object *p;
  ON_Object *p_00;
  ON_3dPoint *Q;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint Q_00;
  ON_3dPoint Q_01;
  bool bVar2;
  bool bVar3;
  ON_ArcCurve *arc;
  ON_ArcCurve *arc_00;
  ON_NurbsCurve *pOVar4;
  ON_Curve **ppOVar5;
  double *pdVar6;
  char *sFormat;
  ON_3dPoint *P_03;
  ON_Line *line;
  int i;
  uint segment_index;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_Line line1;
  ON_Line line0;
  ON_3dPoint C1;
  ON_3dPoint C0;
  
  if ((gap_index < 1) || ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= gap_index))
  {
    sFormat = "Invalid gap_index parameter.";
    iVar7 = 0x4b0;
LAB_0059310e:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
               ,iVar7,"",sFormat);
    return false;
  }
  segment_index = gap_index - 1;
  ppOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  p = (ON_Object *)ppOVar5[segment_index];
  p_00 = (ON_Object *)ppOVar5[(uint)gap_index];
  if (p_00 == (ON_Object *)0x0 || p == (ON_Object *)0x0) {
    sFormat = "Null curve segments.";
    iVar7 = 0x4b8;
    goto LAB_0059310e;
  }
  ON_Curve::PointAtEnd(&P0,(ON_Curve *)p);
  ON_Curve::PointAtStart(&P1,(ON_Curve *)p_00);
  bVar2 = ON_3dPoint::operator==(&P0,&P1);
  if (bVar2) {
    return false;
  }
  Q0.z = P0.z;
  Q0.x = P0.x;
  Q0.y = P0.y;
  Q1.z = P1.z;
  Q1.x = P1.x;
  Q1.y = P1.y;
  arc = ON_ArcCurve::Cast(p);
  arc_00 = ON_ArcCurve::Cast(p_00);
  if (arc_00 == (ON_ArcCurve *)0x0 || arc == (ON_ArcCurve *)0x0) {
    if (arc_00 != (ON_ArcCurve *)0x0 || arc == (ON_ArcCurve *)0x0) {
      if (arc == (ON_ArcCurve *)0x0 && arc_00 != (ON_ArcCurve *)0x0) {
        Q0.z = P1.z;
        Q0.x = P1.x;
        Q0.y = P1.y;
      }
      else {
        ON_Line::ON_Line(&line0);
        ON_Line::ON_Line(&line1);
        if (arc == (ON_ArcCurve *)0x0) {
          bVar2 = ON_Curve::LastSpanIsLinear((ON_Curve *)p,0.0,0.0,&line0);
          bVar3 = ON_Curve::FirstSpanIsLinear((ON_Curve *)p_00,0.0,0.0,&line1);
          if (bVar2 && bVar3) {
            dVar8 = ON_Line::Length(&line0);
            dVar9 = ON_Line::Length(&line1);
            P_01.y = Q0.y;
            P_01.x = Q0.x;
            P_01.z = Q0.z;
            bVar2 = GetLineIsoCoordinates(&line0,P_01,&C0);
            P_02.y = Q1.y;
            P_02.x = Q1.x;
            P_02.z = Q1.z;
            bVar3 = GetLineIsoCoordinates(&line1,P_02,&C1);
            if (bVar2 || bVar3) {
              for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
                pdVar6 = ON_3dPoint::operator[](&C0,iVar7);
                dVar10 = *pdVar6;
                pdVar6 = ON_3dPoint::operator[](&C1,iVar7);
                dVar1 = *pdVar6;
                if ((((dVar10 != -1.23432101234321e+308) || (NAN(dVar10))) ||
                    (dVar1 != -1.23432101234321e+308)) || (NAN(dVar1))) {
                  dVar12 = dVar10;
                  if ((dVar10 == -1.23432101234321e+308) && (!NAN(dVar10))) {
                    dVar12 = dVar1;
                  }
                  if ((dVar10 == dVar1) && (!NAN(dVar10) && !NAN(dVar1))) {
                    dVar12 = dVar10;
                  }
                  dVar11 = (double)(~-(ulong)(dVar9 < dVar8) & (ulong)dVar1 |
                                   -(ulong)(dVar9 < dVar8) & (ulong)dVar10);
                  if ((dVar10 == dVar1) && (!NAN(dVar10) && !NAN(dVar1))) {
                    dVar11 = dVar12;
                  }
                  if ((dVar10 == -1.23432101234321e+308) && (!NAN(dVar10))) {
                    dVar11 = dVar12;
                  }
                  dVar10 = (double)(-(ulong)(dVar1 == -1.23432101234321e+308) & (ulong)dVar12 |
                                   ~-(ulong)(dVar1 == -1.23432101234321e+308) & (ulong)dVar11);
                  if (((dVar10 != -1.23432101234321e+308) || (NAN(dVar10))) &&
                     (bVar2 = ON_IsValid(dVar10), bVar2)) {
                    pdVar6 = ON_3dPoint::operator[](&Q0,iVar7);
                    *pdVar6 = dVar10;
                    pdVar6 = ON_3dPoint::operator[](&Q1,iVar7);
                    *pdVar6 = dVar10;
                  }
                }
              }
            }
          }
          else if (bVar3 || bVar2) {
            P_03 = &P1;
            Q = &Q0;
            if (bVar2) {
              P_03 = &P0;
              Q = &Q1;
            }
            line = &line1;
            if (bVar2) {
              line = &line0;
            }
            SetLineIsoCoords(line,P_03,Q);
          }
        }
        ON_Line::~ON_Line(&line1);
        ON_Line::~ON_Line(&line0);
      }
      goto LAB_005932c7;
    }
  }
  else {
    dVar8 = ON_Arc::Length(&arc_00->m_arc);
    dVar9 = ON_Arc::Length(&arc->m_arc);
    if (dVar9 <= dVar8) {
      Q0.z = P1.z;
      Q0.x = P1.x;
      Q0.y = P1.y;
      goto LAB_005932c7;
    }
  }
  Q1.z = P0.z;
  Q1.x = P0.x;
  Q1.y = P0.y;
LAB_005932c7:
  if ((Q0.x != Q1.x) || (NAN(Q0.x) || NAN(Q1.x))) {
    Q1.x = (P0.x + P1.x) * 0.5;
    Q0.x = Q1.x;
  }
  if ((Q0.y != Q1.y) || (NAN(Q0.y) || NAN(Q1.y))) {
    Q1.y = (P0.y + P1.y) * 0.5;
    Q0.y = Q1.y;
  }
  if ((Q0.z != Q1.z) || (NAN(Q0.z) || NAN(Q1.z))) {
    Q1.z = (P0.z + P1.z) * 0.5;
    Q0.z = Q1.z;
  }
  bVar2 = ON_3dPoint::operator!=(&Q0,&P0);
  if (bVar2) {
    if (arc == (ON_ArcCurve *)0x0) {
      (*p->_vptr_ON_Object[0x3a])(p);
    }
    else {
      P.y = P0.y;
      P.x = P0.x;
      P.z = P0.z;
      Q_00.y = Q0.y;
      Q_00.x = Q0.x;
      Q_00.z = Q0.z;
      pOVar4 = ChangeArcEnd(arc,P,Q_00,1);
      if (pOVar4 != (ON_NurbsCurve *)0x0) {
        ppOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        if (ppOVar5[segment_index] != (ON_Curve *)0x0) {
          (*(ppOVar5[segment_index]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          ppOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        }
        ppOVar5[segment_index] = &pOVar4->super_ON_Curve;
      }
    }
  }
  bVar2 = ON_3dPoint::operator!=(&Q1,&P1);
  if (bVar2) {
    if (arc_00 == (ON_ArcCurve *)0x0) {
      (*p_00->_vptr_ON_Object[0x39])(p_00);
    }
    else {
      P_00.y = P1.y;
      P_00.x = P1.x;
      P_00.z = P1.z;
      Q_01.y = Q1.y;
      Q_01.x = Q1.x;
      Q_01.z = Q1.z;
      pOVar4 = ChangeArcEnd(arc_00,P_00,Q_01,0);
      if (pOVar4 != (ON_NurbsCurve *)0x0) {
        ppOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        if (ppOVar5[(uint)gap_index] != (ON_Curve *)0x0) {
          (*(ppOVar5[(uint)gap_index]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          ppOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        }
        ppOVar5[(uint)gap_index] = &pOVar4->super_ON_Curve;
      }
    }
  }
  bVar2 = HasGapAt(this,segment_index);
  return !bVar2;
}

Assistant:

bool ON_PolyCurve::CloseGap( int gap_index, int ends_to_modify )
{
  const int count = m_segment.Count();

  if ( gap_index <= 0 || gap_index >= count )
  {
    ON_ERROR("Invalid gap_index parameter.");
    return 0; // nothing to do
  }

  ON_Curve* c0 = m_segment[gap_index-1];
  ON_Curve* c1 = m_segment[gap_index];
  if ( 0 == c0 || 0 == c1 )
  {
    ON_ERROR("Null curve segments.");
    return false; // invalid polycurve
  }

  const ON_3dPoint P0 = c0->PointAtEnd();
  const ON_3dPoint P1 = c1->PointAtStart();
  if ( P0 == P1 )
    return false; // nothing to do

  ON_3dPoint Q0(P0);
  ON_3dPoint Q1(P1);

  const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
  const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);

  if ( 0 != arc0 && 0 != arc1 )
  {
    if ( arc1->m_arc.Length() < arc0->m_arc.Length() )
      Q1 = P0;
    else
      Q0 = P1;
  }
  else if ( 0 != arc0 && 0 == arc1 )
  {
    Q1 = P0;
  }
  else if ( 0 != arc1 && 0 == arc0 )
  {
    Q0 = P1;
  }
  else
  {
    ON_Line line0, line1;
    double min_line_length = 0.0;
    double is_linear_tolerance = 0.0;
    bool bLine0 = (0 == arc0)
                ? c0->LastSpanIsLinear(min_line_length,is_linear_tolerance,&line0)
                : false;
    bool bLine1 = (0 == arc0)
                ? c1->FirstSpanIsLinear(min_line_length,is_linear_tolerance,&line1)
                : false;
    if ( bLine0 && bLine1 )
      LineLineTieBreaker(line0,line1,Q0,Q1);
    else if ( bLine0 )
      SetLineIsoCoords(line0,P0,Q1);
    else if ( bLine1 )
      SetLineIsoCoords(line1,P1,Q0);
  }

  if ( Q0.x != Q1.x )
    Q0.x = Q1.x = 0.5*(P0.x + P1.x);
  if ( Q0.y != Q1.y )
    Q0.y = Q1.y = 0.5*(P0.y + P1.y);
  if ( Q0.z != Q1.z )
    Q0.z = Q1.z = 0.5*(P0.z + P1.z);

  if ( Q0 != P0 )
  {
    if ( 0 != arc0 )
    {
      ON_NurbsCurve* nc0 = ChangeArcEnd( arc0, P0, Q0 , 1 );
      if ( nc0 )
      {
        delete m_segment[gap_index-1];
        m_segment[gap_index-1] = nc0;
        c0 = nc0;
        arc0 = 0;
      }
    }
    else
    {
      c0->SetEndPoint(Q0);
    }
  }

  if ( Q1 != P1 )
  {
    if ( 0 != arc1 )
    {
      ON_NurbsCurve* nc1 = ChangeArcEnd( arc1, P1, Q1, 0 );
      if ( nc1 )
      {
        delete m_segment[gap_index];
        m_segment[gap_index] = nc1;
        c0 = nc1;
        arc1 = 0;
      }
    }
    else
    {
      c1->SetStartPoint(Q1);
    }
  }

  return HasGapAt(gap_index-1) ? false : true;
}